

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Flt::render(V2Flt *this,float *dest,float *src,int nsamples,int step)

{
  float fVar1;
  float fVar2;
  int local_70;
  float in_1;
  int i_6;
  float in;
  int i_5;
  float h_2;
  int i_4;
  float h_1;
  int i_3;
  float h;
  int i_2;
  int i_1;
  int i;
  V2Moog m;
  V2LRC flt;
  int step_local;
  int nsamples_local;
  float *src_local;
  float *dest_local;
  V2Flt *this_local;
  
  switch(this->mode & 7) {
  case 0:
    if (dest != src) {
      memmove(dest,src,(long)nsamples << 2);
    }
    break;
  case 1:
    m.b._12_8_ = this->lrc;
    for (i_2 = 0; i_2 < nsamples; i_2 = i_2 + 1) {
      V2LRC::step_2x((V2LRC *)(m.b + 3),src[i_2 * step],this->cfreq,this->res);
      dest[i_2 * step] = m.b[3];
    }
    (this->lrc).l = m.b[3];
    (this->lrc).b = m.b[4];
    break;
  case 2:
    m.b._12_8_ = this->lrc;
    for (h = 0.0; (int)h < nsamples; h = (float)((int)h + 1)) {
      V2LRC::step_2x((V2LRC *)(m.b + 3),src[(int)h * step],this->cfreq,this->res);
      dest[(int)h * step] = m.b[4];
    }
    (this->lrc).l = m.b[3];
    (this->lrc).b = m.b[4];
    break;
  case 3:
    m.b._12_8_ = this->lrc;
    for (i_3 = 0; i_3 < nsamples; i_3 = i_3 + 1) {
      fVar1 = V2LRC::step_2x((V2LRC *)(m.b + 3),src[i_3 * step],this->cfreq,this->res);
      dest[i_3 * step] = fVar1;
    }
    (this->lrc).l = m.b[3];
    (this->lrc).b = m.b[4];
    break;
  case 4:
    m.b._12_8_ = this->lrc;
    for (i_4 = 0; i_4 < nsamples; i_4 = i_4 + 1) {
      fVar1 = V2LRC::step_2x((V2LRC *)(m.b + 3),src[i_4 * step],this->cfreq,this->res);
      dest[i_4 * step] = m.b[3] + fVar1;
    }
    (this->lrc).l = m.b[3];
    (this->lrc).b = m.b[4];
    break;
  case 5:
    m.b._12_8_ = this->lrc;
    for (i_5 = 0; i_5 < nsamples; i_5 = i_5 + 1) {
      fVar1 = V2LRC::step_2x((V2LRC *)(m.b + 3),src[i_5 * step],this->cfreq,this->res);
      dest[i_5 * step] = m.b[3] + m.b[4] + fVar1;
    }
    (this->lrc).l = m.b[3];
    (this->lrc).b = m.b[4];
    break;
  case 6:
    _i_1 = *(undefined8 *)(this->moog).b;
    m.b._0_8_ = *(undefined8 *)((this->moog).b + 2);
    m.b[2] = (this->moog).b[4];
    for (i_6 = 0; i_6 < nsamples; i_6 = i_6 + 1) {
      fVar1 = src[i_6 * step];
      V2Moog::step((V2Moog *)&i_1,fVar1,this->moogf,this->moogp,this->moogq);
      fVar1 = V2Moog::step((V2Moog *)&i_1,fVar1,this->moogf,this->moogp,this->moogq);
      dest[i_6 * step] = fVar1;
    }
    *(undefined8 *)(this->moog).b = _i_1;
    *(undefined8 *)((this->moog).b + 2) = m.b._0_8_;
    (this->moog).b[4] = m.b[2];
    break;
  case 7:
    _i_1 = *(undefined8 *)(this->moog).b;
    m.b._0_8_ = *(undefined8 *)((this->moog).b + 2);
    m.b[2] = (this->moog).b[4];
    for (local_70 = 0; local_70 < nsamples; local_70 = local_70 + 1) {
      fVar1 = src[local_70 * step];
      V2Moog::step((V2Moog *)&i_1,fVar1,this->moogf,this->moogp,this->moogq);
      fVar2 = V2Moog::step((V2Moog *)&i_1,fVar1,this->moogf,this->moogp,this->moogq);
      dest[local_70 * step] = fVar1 - fVar2;
    }
    *(undefined8 *)(this->moog).b = _i_1;
    *(undefined8 *)((this->moog).b + 2) = m.b._0_8_;
    (this->moog).b[4] = m.b[2];
  }
  return;
}

Assistant:

void render(float *dest, const float *src, int nsamples, int step=1)
    {
        V2LRC flt;
        V2Moog m;

        switch (mode & 7)
        {
        case BYPASS:
            COVER("VCF bypass");
            // @@@BUG ignores step? this is wrong but I suppose this
            // never gets hit for stereo case.
            if (dest != src)
                memmove(dest, src, nsamples * sizeof(float));
            break;

        case LOW:
            COVER("VCF low");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = flt.l;
            }
            lrc = flt;
            break;

        case BAND:
            COVER("VCF band");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = flt.b;
            }
            lrc = flt;
            break;

        case HIGH:
            COVER("VCF high");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                float h = flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = h;
            }
            lrc = flt;
            break;

        case NOTCH:
            COVER("VCF notch");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                float h = flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = flt.l + h;
            }
            lrc = flt;
            break;

        case ALL:
            COVER("VCF all");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                float h = flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = flt.l + flt.b + h;
            }
            lrc = flt;
            break;

        case MOOGL:
            COVER("VCF moog low");
            // Moog filters are 2x oversampled, so run filter twice.
            m = moog;
            for (int i=0; i < nsamples; i++)
            {
                float in = src[i*step];
                m.step(in, moogf, moogp, moogq);
                dest[i*step] = m.step(in, moogf, moogp, moogq);
            }
            moog = m;
            break;

        case MOOGH:
            COVER("VCF moog high");
            m = moog;
            for (int i=0; i < nsamples; i++)
            {
                float in = src[i*step];
                m.step(in, moogf, moogp, moogq);
                dest[i*step] = in - m.step(in, moogf, moogp, moogq);
            }
            moog = m;
            break;
        }

        DEBUG_PLOT_STRIDED(this, dest, step, nsamples);
    }